

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_storeBasis(SoPlexBase<double> *this)

{
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *unaff_retaddr;
  
  if ((in_RDI[0x35e].thesize & 1) == 0) {
    *(undefined1 *)&in_RDI[0x337].thesize = 0;
  }
  else {
    *(undefined1 *)&in_RDI[0x337].thesize = 1;
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=(unaff_retaddr,in_RDI);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_storeBasis()
{
   assert(!_storedBasis);

   if(_hasBasis)
   {
      _storedBasis = true;
      _storedBasisStatusCols = _basisStatusCols;
      _storedBasisStatusRows = _basisStatusRows;
   }
   else
      _storedBasis = false;
}